

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_rules_tria.cc
# Opt level: O0

QuadRule * lf::quad::detail::HardcodedQuadRule<(lf::base::RefElType)3,9>(void)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  QuadRule *in_RDI;
  Matrix<double,__1,_1,_0,__1,_1> local_80;
  Matrix<double,__1,__1,_0,__1,__1> local_70;
  RefEl local_55;
  int local_44;
  undefined1 local_40 [8];
  VectorXd weights;
  undefined1 local_28 [8];
  MatrixXd points;
  
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 2;
  weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
       0x13;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_28,
             (int *)((long)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4),
             (int *)&weights.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  local_44 = 0x13;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_40,&local_44);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0);
  *pSVar1 = 0.4896825191987376;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0);
  *pSVar1 = 0.020634961602524784;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,1);
  *pSVar1 = 0.4896825191987376;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,1);
  *pSVar1 = 0.48968251919873773;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,2);
  *pSVar1 = 0.020634961602524704;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,2);
  *pSVar1 = 0.48968251919873784;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,3);
  *pSVar1 = 0.33333333333333326;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,3);
  *pSVar1 = 0.3333333333333334;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,4);
  *pSVar1 = 0.18820353561903264;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,4);
  *pSVar1 = 0.18820353561903289;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,5);
  *pSVar1 = 0.6235929287619344;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,5);
  *pSVar1 = 0.18820353561903272;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,6);
  *pSVar1 = 0.1882035356190329;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,6);
  *pSVar1 = 0.6235929287619346;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,7);
  *pSVar1 = 0.2219629891607657;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,7);
  *pSVar1 = 0.036838412054736314;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,8);
  *pSVar1 = 0.741198598784498;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,8);
  *pSVar1 = 0.22196298916076573;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,9);
  *pSVar1 = 0.03683841205473637;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,9);
  *pSVar1 = 0.7411985987844981;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,10)
  ;
  *pSVar1 = 0.741198598784498;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,10)
  ;
  *pSVar1 = 0.036838412054736314;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0xb
                     );
  *pSVar1 = 0.2219629891607658;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0xb
                     );
  *pSVar1 = 0.7411985987844981;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0xc
                     );
  *pSVar1 = 0.03683841205473613;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0xc
                     );
  *pSVar1 = 0.22196298916076598;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0xd
                     );
  *pSVar1 = 0.4370895914929366;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0xd
                     );
  *pSVar1 = 0.12582081701412678;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0xe
                     );
  *pSVar1 = 0.4370895914929366;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0xe
                     );
  *pSVar1 = 0.4370895914929367;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0xf
                     );
  *pSVar1 = 0.12582081701412667;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0xf
                     );
  *pSVar1 = 0.4370895914929368;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,
                      0x10);
  *pSVar1 = 0.044729513394452566;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,
                      0x10);
  *pSVar1 = 0.04472951339445288;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,
                      0x11);
  *pSVar1 = 0.9105409732110945;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,
                      0x11);
  *pSVar1 = 0.04472951339445253;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,
                      0x12);
  *pSVar1 = 0.044729513394453024;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,
                      0x12);
  *pSVar1 = 0.9105409732110946;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0);
  *pSVar2 = 0.01566735011356954;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,1);
  *pSVar2 = 0.01566735011356954;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,2);
  *pSVar2 = 0.01566735011356954;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,3);
  *pSVar2 = 0.048567898141399425;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,4);
  *pSVar2 = 0.03982386946360514;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,5);
  *pSVar2 = 0.03982386946360514;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,6);
  *pSVar2 = 0.03982386946360514;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,7);
  *pSVar2 = 0.021641769688644688;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,8);
  *pSVar2 = 0.021641769688644688;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,9);
  *pSVar2 = 0.021641769688644688;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,10);
  *pSVar2 = 0.021641769688644688;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0xb);
  *pSVar2 = 0.021641769688644688;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0xc);
  *pSVar2 = 0.021641769688644688;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0xd);
  *pSVar2 = 0.03891377050238714;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0xe);
  *pSVar2 = 0.03891377050238714;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0xf);
  *pSVar2 = 0.03891377050238714;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0x10);
  *pSVar2 = 0.012788837829349017;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0x11);
  *pSVar2 = 0.012788837829349017;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_40,0x12);
  *pSVar2 = 0.012788837829349017;
  local_55 = lf::base::RefEl::kTria();
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            (&local_70,(Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            (&local_80,(Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  QuadRule::QuadRule(in_RDI,local_55,&local_70,&local_80,9);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_80);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_70);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_40);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  return in_RDI;
}

Assistant:

QuadRule HardcodedQuadRule<base::RefEl::kTria(), 9>() { // NOLINT
  Eigen::MatrixXd points(2, 19);
  Eigen::VectorXd weights(19);

  points(0, 0) = 0.48968251919873762024;
  points(1, 0) = 0.020634961602524783814;
  points(0, 1) = 0.48968251919873762024;
  points(1, 1) = 0.48968251919873773126;
  points(0, 2) = 0.020634961602524704016;
  points(1, 2) = 0.48968251919873784228;
  points(0, 3) = 0.33333333333333325932;
  points(1, 3) = 0.33333333333333342585;
  points(0, 4) = 0.18820353561903263584;
  points(1, 4) = 0.18820353561903288564;
  points(0, 5) = 0.62359292876193439525;
  points(1, 5) = 0.18820353561903271911;
  points(0, 6) = 0.1882035356190329134;
  points(1, 6) = 0.6235929287619346173;
  points(0, 7) = 0.22196298916076570573;
  points(1, 7) = 0.036838412054736313639;
  points(0, 8) = 0.74119859878449800838;
  points(1, 8) = 0.22196298916076573349;
  points(0, 9) = 0.03683841205473636915;
  points(1, 9) = 0.74119859878449811941;
  points(0, 10) = 0.74119859878449800838;
  points(1, 10) = 0.036838412054736313639;
  points(0, 11) = 0.221962989160765789;
  points(1, 11) = 0.74119859878449811941;
  points(0, 12) = 0.036838412054736133228;
  points(1, 12) = 0.22196298916076598329;
  points(0, 13) = 0.43708959149293657998;
  points(1, 13) = 0.12582081701412678454;
  points(0, 14) = 0.43708959149293657998;
  points(1, 14) = 0.437089591492936691;
  points(0, 15) = 0.12582081701412667352;
  points(1, 15) = 0.43708959149293680202;
  points(0, 16) = 0.044729513394452566355;
  points(1, 16) = 0.044729513394452878605;
  points(0, 17) = 0.91054097321109450647;
  points(1, 17) = 0.04472951339445253166;
  points(0, 18) = 0.044729513394453024322;
  points(1, 18) = 0.91054097321109461749;

  weights(0) = 0.015667350113569539216;
  weights(1) = 0.015667350113569539216;
  weights(2) = 0.015667350113569539216;
  weights(3) = 0.048567898141399425127;
  weights(4) = 0.039823869463605138241;
  weights(5) = 0.039823869463605138241;
  weights(6) = 0.039823869463605138241;
  weights(7) = 0.021641769688644688086;
  weights(8) = 0.021641769688644688086;
  weights(9) = 0.021641769688644688086;
  weights(10) = 0.021641769688644688086;
  weights(11) = 0.021641769688644688086;
  weights(12) = 0.021641769688644688086;
  weights(13) = 0.038913770502387139139;
  weights(14) = 0.038913770502387139139;
  weights(15) = 0.038913770502387139139;
  weights(16) = 0.012788837829349017361;
  weights(17) = 0.012788837829349017361;
  weights(18) = 0.012788837829349017361;

  return QuadRule(base::RefEl::kTria(), std::move(points), std::move(weights), 9);
}